

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O0

void __thiscall
Clasp::DefaultUnfoundedCheck::addIfReason(DefaultUnfoundedCheck *this,BodyPtr *n,uint32 uScc)

{
  AddReasonLit *pAVar1;
  bool bVar2;
  reference pBVar3;
  reference ppEVar4;
  uint in_EDX;
  DefaultUnfoundedCheck *in_RSI;
  AddReasonLit *in_RDI;
  AddReasonLit addFalseLits;
  weight_t S;
  bool inF;
  Solver *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar5;
  weight_t wVar6;
  Literal p;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar7;
  DefaultUnfoundedCheck *this_00;
  
  p.rep_ = *(uint32 *)(in_RSI->super_PostPropagator).super_Constraint._vptr_Constraint;
  bVar2 = Solver::isFalse(in_stack_ffffffffffffffa8,(Literal)(uint32)((ulong)in_RDI >> 0x20));
  uVar7 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffe8);
  bVar2 = Asp::PrgDepGraph::BodyNode::extended
                    ((BodyNode *)(in_RSI->super_PostPropagator).super_Constraint._vptr_Constraint);
  if ((bVar2) &&
     ((*(uint *)((long)(in_RSI->super_PostPropagator).super_Constraint._vptr_Constraint + 4) &
      0xfffffff) == in_EDX)) {
    pBVar3 = bk_lib::
             pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
             ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                           *)&in_RDI[2].node,*(size_type *)&(in_RSI->super_PostPropagator).next);
    if (-1 < *(int *)pBVar3) {
      pAVar1 = in_RDI + 6;
      this_00 = in_RSI;
      pBVar3 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                             *)&in_RDI[2].node,*(size_type *)&(in_RSI->super_PostPropagator).next);
      ppEVar4 = bk_lib::
                pod_vector<Clasp::DefaultUnfoundedCheck::ExtData_*,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtData_*>_>
                ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::ExtData_*,_std::allocator<Clasp::DefaultUnfoundedCheck::ExtData_*>_>
                              *)&pAVar1->node,pBVar3->lower_or_ext);
      wVar6 = (*ppEVar4)->slack;
      bVar2 = isExternal(this_00,(BodyPtr *)CONCAT44(in_EDX,uVar7),
                         (weight_t *)CONCAT44(p.rep_,wVar6));
      if (bVar2) {
        if ((uVar7 & 0x1000000) == 0) {
          Asp::PrgDepGraph::visitBodyLiterals<Clasp::DefaultUnfoundedCheck::AddReasonLit>
                    ((PrgDepGraph *)CONCAT44(in_stack_ffffffffffffffd4,wVar6),
                     (BodyNode *)(this_00->super_PostPropagator).super_Constraint._vptr_Constraint,
                     in_RDI);
        }
        else {
          addReasonLit((DefaultUnfoundedCheck *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),p);
        }
      }
      pBVar3 = bk_lib::
               pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
               ::operator[]((pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
                             *)&in_RDI[2].node,*(size_type *)&(this_00->super_PostPropagator).next);
      *(uint *)pBVar3 = *(uint *)pBVar3 & 0x7fffffff | 0x80000000;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,(uint *)in_RSI);
    }
  }
  else if ((uVar7 & 0x1000000) != 0) {
    uVar5 = *(undefined4 *)(in_RSI->super_PostPropagator).super_Constraint._vptr_Constraint;
    bVar2 = Solver::seen(in_stack_ffffffffffffffa8,(Literal)(uint32)((ulong)in_RDI >> 0x20));
    if ((!bVar2) &&
       (((*(uint *)((long)(in_RSI->super_PostPropagator).super_Constraint._vptr_Constraint + 4) &
         0xfffffff) != in_EDX ||
        (bVar2 = isExternal(in_RSI,(BodyPtr *)CONCAT44(in_EDX,uVar7),
                            (weight_t *)((ulong)p.rep_ << 0x20)), bVar2)))) {
      addReasonLit((DefaultUnfoundedCheck *)
                   CONCAT44(uVar5,*(undefined4 *)
                                   (in_RSI->super_PostPropagator).super_Constraint._vptr_Constraint)
                   ,p);
    }
  }
  return;
}

Assistant:

void DefaultUnfoundedCheck::addIfReason(const BodyPtr& n, uint32 uScc) {
	bool inF = solver_->isFalse(n.node->lit);
	weight_t S;
	if (!n.node->extended() || n.node->scc != uScc) {
		if (inF && !solver_->seen(n.node->lit) && (n.node->scc != uScc || isExternal(n, (S=0)))) {
			addReasonLit(n.node->lit);
		}
	}
	else if (bodies_[n.id].picked == 0) {
		if (isExternal(n, S = extended_[bodies_[n.id].lower_or_ext]->slack)) {
			AddReasonLit addFalseLits = { this, n.node, S };
			if (inF) { addReasonLit(n.node->lit); }
			else     { graph_->visitBodyLiterals(*n.node, addFalseLits); }
		}
		bodies_[n.id].picked = 1;
		pickedExt_.push_back(n.id);
	}
}